

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t parse_htime_item(archive_read *a,char unix_time,uint64_t *where,ssize_t *extra_data_size)

{
  ulong uVar1;
  wchar_t wVar2;
  ulong *puVar3;
  int64_t iVar4;
  uint64_t uVar5;
  uint32_t time_val;
  ssize_t avail;
  wchar_t local_34;
  ssize_t local_30;
  
  if (unix_time == '\0') {
    uVar5 = 0xfffffffd49ef6f00;
    local_30 = -1;
    puVar3 = (ulong *)__archive_read_ahead(a,8,&local_30);
    if (puVar3 == (ulong *)0x0) {
      wVar2 = L'\x01';
    }
    else {
      uVar1 = *puVar3;
      iVar4 = __archive_read_consume(a,8);
      wVar2 = (wchar_t)CONCAT71((int7)((ulong)iVar4 >> 8),iVar4 != 8);
      uVar5 = uVar1 / 10000000 - 0x2b6109100;
    }
    if ((char)wVar2 == '\0') {
      *where = uVar5;
      *extra_data_size = *extra_data_size + -8;
    }
  }
  else {
    wVar2 = read_u32(a,(uint32_t *)&local_34);
    if (wVar2 != L'\0') {
      *extra_data_size = *extra_data_size + -4;
      *where = (ulong)(uint)local_34;
      wVar2 = local_34;
    }
  }
  return wVar2;
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    uint64_t* where, ssize_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*where = (uint64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		*where = time_win_to_unix(windows_time);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}